

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.h
# Opt level: O2

VariableIndex __thiscall
cnn::ComputationGraph::add_function<cnn::Zeroes,cnn::Dim>(ComputationGraph *this,Dim *arguments)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  undefined8 *in_RDX;
  Node *local_20;
  
  *(int *)&(this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
           super__Vector_impl_data._M_start =
       (int)((ulong)(*(long *)(arguments->d + 2) - *(long *)arguments->d) >> 3);
  local_20 = (Node *)operator_new(0x78);
  (local_20->dim).nd = 0;
  (local_20->dim).bd = 1;
  (local_20->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_20->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_20->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_20->_vptr_Node = (_func_int **)&PTR__Node_0035d600;
  pVVar1 = (pointer)in_RDX[1];
  pVVar2 = (pointer)in_RDX[2];
  pVVar3 = (pointer)in_RDX[3];
  local_20[1]._vptr_Node = (_func_int **)*in_RDX;
  local_20[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = pVVar1;
  local_20[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = pVVar2;
  local_20[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pVVar3;
  local_20[1].dim.d[0] = *(uint *)(in_RDX + 4);
  std::vector<cnn::Node*,std::allocator<cnn::Node*>>::emplace_back<cnn::Node*>
            ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)arguments,&local_20);
  set_dim_for_new_node((ComputationGraph *)arguments,(VariableIndex *)this);
  return (VariableIndex)(uint)this;
}

Assistant:

inline VariableIndex ComputationGraph::add_function(const T& arguments) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new Function(arguments));
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}